

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int CreateSocketAddress(sockaddr_in *sockaddrPtr,char *host,int port)

{
  uint16_t uVar1;
  hostent *phVar2;
  int *piVar3;
  char local_4e8 [8];
  char localhost [1200];
  in_addr addr;
  hostent *hostent;
  int port_local;
  char *host_local;
  sockaddr_in *sockaddrPtr_local;
  
  strcpy(local_4e8,host);
  memset(sockaddrPtr,0,0x10);
  sockaddrPtr->sin_family = 2;
  uVar1 = htons((uint16_t)port);
  sockaddrPtr->sin_port = uVar1;
  if (host == (char *)0x0) {
    localhost[0x4ac] = '\0';
    localhost[0x4ad] = '\0';
    localhost[0x4ae] = '\0';
    localhost[0x4af] = '\0';
  }
  else {
    localhost._1196_4_ = inet_addr(local_4e8);
    if (localhost._1196_4_ == 0xffffffff) {
      phVar2 = gethostbyname(local_4e8);
      if (phVar2 == (hostent *)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0x71;
        return 0;
      }
      memcpy(localhost + 0x4ac,*phVar2->h_addr_list,(long)phVar2->h_length);
    }
  }
  (sockaddrPtr->sin_addr).s_addr = localhost._1196_4_;
  return 1;
}

Assistant:

static int
CreateSocketAddress(
    struct sockaddr_in *sockaddrPtr,	/* Socket address */
    char *host,				/* Host.  NULL implies INADDR_ANY */
    int port)				/* Port number */
{
    struct hostent *hostent;		/* Host database entry */
    struct in_addr addr;		/* For 64/32 bit madness */
    char localhost[MAXLEN];

    strcpy(localhost,host);

    memset((void *) sockaddrPtr, '\0', sizeof(struct sockaddr_in));
    sockaddrPtr->sin_family = AF_INET;
    sockaddrPtr->sin_port = htons((unsigned short) (port & 0xFFFF));
    if (host == NULL) {
	addr.s_addr = INADDR_ANY;
    } else {
        addr.s_addr = inet_addr(localhost);
        if (addr.s_addr == 0xFFFFFFFF) {
            hostent = gethostbyname(localhost);
            if (hostent != NULL) {
                memcpy((void *) &addr,
                        (void *) hostent->h_addr_list[0],
                        (size_t) hostent->h_length);
            } else {
#ifdef	EHOSTUNREACH
                errno = EHOSTUNREACH;
#else
#ifdef ENXIO
                errno = ENXIO;
#endif
#endif
                return 0;	/* error */
            }
        }
    }
        
    /*
     * NOTE: On 64 bit machines the assignment below is rumored to not
     * do the right thing. Please report errors related to this if you
     * observe incorrect behavior on 64 bit machines such as DEC Alphas.
     * Should we modify this code to do an explicit memcpy?
     */

    sockaddrPtr->sin_addr.s_addr = addr.s_addr;
    return 1;	/* Success. */
}